

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confidence.cc
# Opt level: O2

void predict_or_learn_with_confidence<true,false>
               (confidence *param_1,single_learner *base,example *ec)

{
  float fVar1;
  float fVar2;
  
  fVar1 = (ec->l).simple.label;
  if ((fVar1 == 3.4028235e+38) && (!NAN(fVar1))) {
    LEARNER::learner<char,_example>::predict(base,ec,0);
    (ec->l).simple.label = *(float *)(&DAT_002631ec + (ulong)(0.0 < (ec->pred).scalar) * 4);
  }
  fVar2 = LEARNER::learner<char,_example>::sensitivity(base,ec,0);
  (ec->l).simple.label = fVar1;
  LEARNER::learner<char,_example>::learn(base,ec,0);
  ec->confidence = ABS((ec->pred).scalar) / fVar2;
  return;
}

Assistant:

void predict_or_learn_with_confidence(confidence& /* c */, single_learner& base, example& ec)
{
  float threshold = 0.f;
  float sensitivity = 0.f;

  float existing_label = ec.l.simple.label;
  if (existing_label == FLT_MAX)
    {
      base.predict(ec);
      float opposite_label = 1.f;
      if (ec.pred.scalar > 0)
        opposite_label = -1.f;
      ec.l.simple.label = opposite_label;
    }

  if (!is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  ec.l.simple.label = existing_label;
  if (is_learn)
    base.learn(ec);
  else
    base.predict(ec);

  if (is_confidence_after_training)
    sensitivity = base.sensitivity(ec);

  ec.confidence = fabsf(ec.pred.scalar - threshold) / sensitivity;
}